

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O2

int Abc_NodeBalanceFindLeft(Vec_Ptr_t *vSuper)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = vSuper->nSize;
  iVar3 = 0;
  if (2 < iVar4) {
    pvVar1 = Vec_PtrEntry(vSuper,iVar4 + -2);
    iVar4 = iVar4 + -3;
    while ((iVar3 = -1, -1 < iVar4 &&
           (pvVar2 = Vec_PtrEntry(vSuper,iVar4), iVar3 = iVar4,
           (*(uint *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x14) ^
           *(uint *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x14)) < 0x1000))) {
      iVar4 = iVar4 + -1;
    }
    iVar3 = iVar3 + 1;
    pvVar2 = Vec_PtrEntry(vSuper,iVar3);
    if (0xfff < (*(uint *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 0x14) ^
                *(uint *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 0x14))) {
      __assert_fail("Abc_ObjRegular(pNodeLeft)->Level == Abc_ObjRegular(pNodeRight)->Level",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                    ,0xb0,"int Abc_NodeBalanceFindLeft(Vec_Ptr_t *)");
    }
  }
  return iVar3;
}

Assistant:

int Abc_NodeBalanceFindLeft( Vec_Ptr_t * vSuper )
{
    Abc_Obj_t * pNodeRight, * pNodeLeft;
    int Current;
    // if two or less nodes, pair with the first
    if ( Vec_PtrSize(vSuper) < 3 )
        return 0;
    // set the pointer to the one before the last
    Current = Vec_PtrSize(vSuper) - 2;
    pNodeRight = (Abc_Obj_t *)Vec_PtrEntry( vSuper, Current );
    // go through the nodes to the left of this one
    for ( Current--; Current >= 0; Current-- )
    {
        // get the next node on the left
        pNodeLeft = (Abc_Obj_t *)Vec_PtrEntry( vSuper, Current );
        // if the level of this node is different, quit the loop
        if ( Abc_ObjRegular(pNodeLeft)->Level != Abc_ObjRegular(pNodeRight)->Level )
            break;
    }
    Current++;    
    // get the node, for which the equality holds
    pNodeLeft = (Abc_Obj_t *)Vec_PtrEntry( vSuper, Current );
    assert( Abc_ObjRegular(pNodeLeft)->Level == Abc_ObjRegular(pNodeRight)->Level );
    return Current;
}